

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O2

bool_t gf2QSolve(word *x,word *a,word *b,qr_o *f,void *stack)

{
  void *stack_00;
  bool_t bVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  lVar2 = *f->params;
  stack_00 = (void *)((long)stack + f->n * 8);
  bVar1 = wwIsZero(a,f->n);
  if (bVar1 == 0) {
    bVar1 = wwIsZero(b,f->n);
    if (bVar1 == 0) {
      (*f->sqr)((word *)stack,a,f,stack_00);
      (*f->div)((word *)stack,b,(word *)stack,f,stack_00);
      bVar1 = gf2Tr((word *)stack,f,stack_00);
      if (bVar1 != 0) {
        return 0;
      }
      wwCopy(x,(word *)stack,f->n);
      uVar3 = lVar2 - 1U >> 1;
      while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
        (*f->sqr)(x,x,f,stack_00);
        (*f->sqr)(x,x,f,stack_00);
        wwXor2(x,(word *)stack,f->n);
      }
      (*f->mul)(x,x,a,f,stack_00);
    }
    else {
      wwSetZero(x,f->n);
    }
  }
  else {
    wwCopy(x,b,f->n);
    while (lVar2 = lVar2 + -1, lVar2 != 0) {
      (*f->sqr)(x,x,f,stack_00);
    }
  }
  return 1;
}

Assistant:

bool_t gf2QSolve(word x[], const word a[], const word b[],
	const qr_o* f, void* stack)
{
	size_t m = gf2Deg(f);
	word* t = (word*)stack;
	stack = t + f->n;
	// pre
	ASSERT(gf2IsOperable(f));
	ASSERT(gf2IsIn(a, f));
	ASSERT(gf2IsIn(b, f));
	ASSERT(x + f->n <= a || x >= a + f->n);
	ASSERT(m % 2);
	// a == 0?
	if (qrIsZero(a, f))
	{
		// x <- b^{2^{m - 1}}
		qrCopy(x, b, f);
		while (--m)
			qrSqr(x, x, f, stack);
		return TRUE;
	}
	// a != 0, b == 0?
	if (qrIsZero(b, f))
	{
		qrSetZero(x, f);
		return TRUE;
	}
	// t <- ba^{-2}
	qrSqr(t, a, f, stack);
	qrDiv(t, b, t, f, stack);
	// tr(t) == 1?
	if (gf2Tr(t, f, stack))
		return FALSE;
	// x <- htr(t) (полуслед)
	qrCopy(x, t, f);
	m = (m - 1) / 2;
	while (m--)
	{
		qrSqr(x, x, f, stack);
		qrSqr(x, x, f, stack);
		gf2Add2(x, t, f);
	}
	// x <- x * a
	qrMul(x, x, a, f, stack);
	// решение есть
	return TRUE;
}